

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_agent_forwarding.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  in_addr_t iVar2;
  int __fd;
  int iVar3;
  int iVar4;
  LIBSSH2_SESSION *session;
  long lVar5;
  size_t sVar6;
  long lVar7;
  libssh2_agent_publickey *plVar8;
  long lVar9;
  char *pcVar10;
  size_t sStackY_4070;
  ulong in_stack_ffffffffffffbf98;
  libssh2_agent_publickey *identity;
  long local_4058;
  char *exitsignal;
  sockaddr_in sin;
  char buffer [16384];
  
  exitsignal = "none";
  if (argc < 2) {
    fwrite("At least IP and username arguments are required.\n",0x31,1,_stderr);
    return 1;
  }
  hostname = argv[1];
  username = argv[2];
  if (3 < (uint)argc) {
    commandline = argv[3];
  }
  uVar1 = libssh2_init(0);
  if (uVar1 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
    return 1;
  }
  iVar2 = inet_addr(hostname);
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fwrite("failed to create socket.\n",0x19,1,_stderr);
    goto LAB_0010165c;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = iVar2;
  iVar3 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar3 == 0) {
    session = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0,0);
    if (session != (LIBSSH2_SESSION *)0x0) {
      iVar3 = libssh2_session_handshake(session,__fd);
      if (iVar3 == 0) {
        lVar5 = libssh2_agent_init(session);
        if (lVar5 == 0) {
          pcVar10 = "Failure initializing ssh-agent support\n";
          sStackY_4070 = 0x27;
        }
        else {
          iVar3 = libssh2_agent_connect(lVar5);
          if (iVar3 == 0) {
            iVar3 = libssh2_agent_list_identities(lVar5);
            if (iVar3 == 0) {
              plVar8 = (libssh2_agent_publickey *)0x0;
              while (iVar3 = libssh2_agent_get_identity(lVar5,&identity,plVar8), iVar3 != 1) {
                if (iVar3 < 0) {
                  pcVar10 = "Failure obtaining identity from ssh-agent support\n";
                  sStackY_4070 = 0x32;
                  goto LAB_00101621;
                }
                iVar4 = libssh2_agent_userauth(lVar5,username,identity);
                if (iVar4 == 0) {
                  fprintf(_stderr,"Authentication with username %s and public key %s succeeded.\n",
                          username,identity->comment);
                  if (iVar3 == 0) {
                    libssh2_session_set_blocking(session,0);
                    goto LAB_001015c3;
                  }
                  break;
                }
                fprintf(_stderr,"Authentication with username %s and public key %s failed.\n",
                        username,identity->comment);
                plVar8 = identity;
              }
              pcVar10 = "Could not continue authentication\n";
              sStackY_4070 = 0x22;
            }
            else {
              pcVar10 = "Failure requesting identities to ssh-agent\n";
              sStackY_4070 = 0x2b;
            }
          }
          else {
            pcVar10 = "Failure connecting to ssh-agent\n";
            sStackY_4070 = 0x20;
          }
        }
LAB_00101621:
        fwrite(pcVar10,sStackY_4070,1,_stderr);
      }
      else {
        fprintf(_stderr,"Failure establishing SSH session: %d\n",0);
      }
      goto LAB_0010162a;
    }
    pcVar10 = "Could not initialize SSH session.\n";
    sStackY_4070 = 0x22;
  }
  else {
    pcVar10 = "failed to connect.\n";
    sStackY_4070 = 0x13;
  }
  fwrite(pcVar10,sStackY_4070,1,_stderr);
LAB_0010164b:
  shutdown(__fd,2);
  close(__fd);
LAB_0010165c:
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
LAB_001015c3:
  in_stack_ffffffffffffbf98 = in_stack_ffffffffffffbf98 & 0xffffffff00000000;
  lVar5 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0,in_stack_ffffffffffffbf98);
  if (lVar5 != 0) goto LAB_00101694;
  iVar3 = libssh2_session_last_error(session,0,0,0);
  if (iVar3 != -0x25) goto LAB_00101856;
  waitsocket(__fd,session);
  goto LAB_001015c3;
LAB_00101694:
  while (uVar1 = libssh2_channel_request_auth_agent(lVar5), uVar1 == 0xffffffdb) {
    waitsocket(__fd,session);
  }
  if (uVar1 != 0) {
    fprintf(_stderr,"Error, could not request auth agent, error code %d.\n",(ulong)uVar1);
LAB_0010188e:
    exit(1);
  }
  fwrite("Agent forwarding request succeeded.\n",0x24,1,_stdout);
  while( true ) {
    pcVar10 = commandline;
    sVar6 = strlen(commandline);
    iVar3 = libssh2_channel_process_startup(lVar5,"exec",4,pcVar10,sVar6 & 0xffffffff);
    if (iVar3 != -0x25) break;
    waitsocket(__fd,session);
  }
  if (iVar3 != 0) {
LAB_00101856:
    fwrite("Error\n",6,1,_stderr);
    goto LAB_0010188e;
  }
  lVar9 = 0;
  while( true ) {
    while (lVar7 = libssh2_channel_read_ex(lVar5,0,buffer,0x4000), 0 < lVar7) {
      local_4058 = lVar9;
      fwrite("We read:\n",9,1,_stderr);
      for (lVar9 = 0; lVar7 != lVar9; lVar9 = lVar9 + 1) {
        fputc((int)buffer[lVar9],_stderr);
      }
      lVar9 = local_4058 + lVar7;
      fputc(10,_stderr);
    }
    if (lVar7 != -0x25) break;
    waitsocket(__fd,session);
  }
  fprintf(_stderr,"libssh2_channel_read returned %ld\n",lVar7);
  while (iVar3 = libssh2_channel_close(lVar5), iVar3 == -0x25) {
    waitsocket(__fd,session);
  }
  pcVar10 = "none";
  if (iVar3 == 0) {
    uVar1 = libssh2_channel_get_exit_status(lVar5);
    libssh2_channel_get_exit_signal(lVar5,&exitsignal,0,0,0,0,0);
    pcVar10 = exitsignal;
    if (exitsignal != (char *)0x0) goto LAB_0010182e;
    fprintf(_stderr,"\nEXIT: %d bytecount: %ld\n",(ulong)uVar1,lVar9);
  }
  else {
LAB_0010182e:
    fprintf(_stderr,"\nGot signal: %s\n",pcVar10);
  }
  libssh2_channel_free(lVar5);
LAB_0010162a:
  libssh2_session_disconnect_ex(session,0xb,"Normal Shutdown","");
  libssh2_session_free(session);
  goto LAB_0010164b;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_AGENT *agent = NULL;
    struct libssh2_agent_publickey *identity, *prev_identity = NULL;
    int exitcode;
    char *exitsignal = (char *)"none";
    ssize_t bytecount = 0;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc < 2) {
        fprintf(stderr, "At least IP and username arguments are required.\n");
        return 1;
    }
    /* must be ip address only */
    hostname = argv[1];
    username = argv[2];

    if(argc > 3) {
        commandline = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    hostaddr = inet_addr(hostname);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    if(libssh2_session_handshake(session, sock) != 0) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* Connect to the ssh-agent */
    agent = libssh2_agent_init(session);
    if(!agent) {
        fprintf(stderr, "Failure initializing ssh-agent support\n");
        rc = 1;
        goto shutdown;
    }
    if(libssh2_agent_connect(agent)) {
        fprintf(stderr, "Failure connecting to ssh-agent\n");
        rc = 1;
        goto shutdown;
    }
    if(libssh2_agent_list_identities(agent)) {
        fprintf(stderr, "Failure requesting identities to ssh-agent\n");
        rc = 1;
        goto shutdown;
    }
    for(;;) {
        rc = libssh2_agent_get_identity(agent, &identity, prev_identity);
        if(rc == 1)
            break;
        if(rc < 0) {
            fprintf(stderr,
                    "Failure obtaining identity from ssh-agent support\n");
            rc = 1;
            goto shutdown;
        }
        if(libssh2_agent_userauth(agent, username, identity)) {
            fprintf(stderr, "Authentication with username %s and "
                    "public key %s failed.\n",
                    username, identity->comment);
        }
        else {
            fprintf(stderr, "Authentication with username %s and "
                    "public key %s succeeded.\n",
                    username, identity->comment);
            break;
        }
        prev_identity = identity;
    }
    if(rc) {
        fprintf(stderr, "Could not continue authentication\n");
        goto shutdown;
    }

#if 0
    libssh2_trace(session, ~0);
#endif

    /* Set session to non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* Exec non-blocking on the remote host */
    do {
        channel = libssh2_channel_open_session(session);
        if(channel ||
           libssh2_session_last_error(session, NULL, NULL, 0) !=
           LIBSSH2_ERROR_EAGAIN)
            break;
        waitsocket(sock, session);
    } while(1);
    if(!channel) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    while((rc = libssh2_channel_request_auth_agent(channel)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "Error, could not request auth agent, "
                "error code %d.\n", rc);
        exit(1);
    }
    else {
        fprintf(stdout, "Agent forwarding request succeeded.\n");
    }
    while((rc = libssh2_channel_exec(channel, commandline)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    for(;;) {
        ssize_t nread;
        /* loop until we block */
        do {
            char buffer[0x4000];
            nread = libssh2_channel_read(channel, buffer, sizeof(buffer) );
            if(nread > 0) {
                ssize_t i;
                bytecount += nread;
                fprintf(stderr, "We read:\n");
                for(i = 0; i < nread; ++i)
                    fputc(buffer[i], stderr);
                fprintf(stderr, "\n");
            }
            else {
                if(nread != LIBSSH2_ERROR_EAGAIN)
                    /* no need to output this for the EAGAIN case */
                    fprintf(stderr, "libssh2_channel_read returned %ld\n",
                            (long)nread);
            }
        }
        while(nread > 0);

        /* this is due to blocking that would occur otherwise so we loop on
           this condition */
        if(nread == LIBSSH2_ERROR_EAGAIN) {
            waitsocket(sock, session);
        }
        else
            break;
    }
    exitcode = 127;
    while((rc = libssh2_channel_close(channel)) == LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc == 0) {
        exitcode = libssh2_channel_get_exit_status(channel);
        libssh2_channel_get_exit_signal(channel, &exitsignal,
                                        NULL, NULL, NULL, NULL, NULL);
    }

    if(exitsignal) {
        fprintf(stderr, "\nGot signal: %s\n", exitsignal);
    }
    else {
        fprintf(stderr, "\nEXIT: %d bytecount: %ld\n",
                exitcode, (long)bytecount);
    }

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}